

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerImpl::Init
          (Error *__return_storage_ptr__,CommissionerImpl *this,Config *aConfig)

{
  Config *this_00;
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  __shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined1 local_c0 [104];
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ValidateConfig((Error *)local_c0,aConfig);
  pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_c0);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)(local_c0 + 8));
  if (EVar1 == kNone) {
    this_00 = &this->mConfig;
    Config::operator=(this_00,aConfig);
    std::__shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,
               &(aConfig->mLogger).
                super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>);
    InitLogger((shared_ptr<ot::commissioner::Logger> *)&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    LoggingConfig(this);
    GetDtlsConfig((DtlsConfig *)local_c0,this_00);
    DtlsSession::Init((Error *)local_58,&(this->mBrClient).mDtlsSession,(DtlsConfig *)local_c0);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_58);
    EVar1 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_58 + 8));
    DtlsConfig::~DtlsConfig((DtlsConfig *)local_c0);
    if (EVar1 == kNone) {
      iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
      if ((char)iVar2 != '\0') {
        TokenManager::Init((Error *)local_c0,&this->mTokenManager,this_00);
        Error::operator=(__return_storage_ptr__,(Error *)local_c0);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::Init(const Config &aConfig)
{
    Error error;

    SuccessOrExit(error = ValidateConfig(aConfig));
    mConfig = aConfig;

    InitLogger(aConfig.mLogger);
    LoggingConfig();

    SuccessOrExit(error = mBrClient.Init(GetDtlsConfig(mConfig)));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        // It is not good to leave the token manager uninitialized in non-CCM mode.
        // TODO(wgtdkp): create TokenManager only in CCM Mode.
        SuccessOrExit(error = mTokenManager.Init(mConfig));
    }
#endif

exit:
    return error;
}